

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

void __thiscall Face::print(Face *this)

{
  int iVar1;
  int local_28;
  int local_24;
  int j_1;
  int entry;
  int j;
  int row_len;
  int layer;
  Corner ref_corner;
  Face *this_local;
  
  if (this->center_color == green) {
    row_len = 3;
  }
  else {
    row_len = 0;
  }
  for (j = 0; j < 4; j = j + 1) {
    iVar1 = j * 2 + 1;
    j_1 = 0;
    while( true ) {
      if ((7 - iVar1) / 2 <= j_1) break;
      printf(" ");
      j_1 = j_1 + 1;
    }
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      print_triangle(this,row_len,j,local_24);
    }
    local_28 = 0;
    while( true ) {
      if ((7 - iVar1) / 2 <= local_28) break;
      printf(" ");
      local_28 = local_28 + 1;
    }
    printf("\n");
  }
  return;
}

Assistant:

void Face::print(){
    Corner ref_corner;
    if(center_color == Color::green){
        ref_corner = Corner::B;
    }
    else{
        ref_corner = Corner::U;
    }
    for(int layer = 0; layer < 4; layer++){
        int row_len = 2*layer + 1;
        for(int j = 0; j < (7-row_len)/2; j++){
            printf(" ");
        }
        for(int entry = 0; entry < row_len; entry++){
            print_triangle(ref_corner, layer, entry);
        }
        for(int j = 0; j < (7-row_len)/2; j++){
            printf(" ");
        }
        printf("\n");
    }
}